

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::VertexArrays::GetVertexArrayIndexedTest::GetVertexArrayIndexedTest
          (GetVertexArrayIndexedTest *this,Context *context)

{
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"vertex_arrays_get_vertex_array_indexed",
             "Get Vertex Array Indexed Test");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01dd84a8;
  this->m_vao = 0;
  this->m_bo[0] = 0;
  this->m_bo[1] = 0;
  this->m_bo[2] = 0;
  this->m_bo[3] = 0;
  return;
}

Assistant:

GetVertexArrayIndexedTest::GetVertexArrayIndexedTest(deqp::Context& context)
	: deqp::TestCase(context, "vertex_arrays_get_vertex_array_indexed", "Get Vertex Array Indexed Test"), m_vao(0)
{
	m_bo[0] = 0;
	m_bo[1] = 0;
	m_bo[2] = 0;
	m_bo[3] = 0;
}